

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

unsigned_long
duckdb::DecimalMultiplyOverflowCheck::Operation<unsigned_long,unsigned_long,unsigned_long>
          (unsigned_long left,unsigned_long right)

{
  bool bVar1;
  OutOfRangeException *this;
  allocator local_49;
  unsigned_long result;
  string local_40;
  
  bVar1 = TryDecimalMultiply::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_49);
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long>(this,&local_40,left,right);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalMultiply::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}